

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O2

void __thiscall AsyncLogging::append(AsyncLogging *this,char *logline,int len)

{
  BufferPtr *this_00;
  element_type *peVar1;
  char *pcVar2;
  FixedBuffer<4000000> *__p;
  char **ppcVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  peVar1 = (this->currentBuffer_).
           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = peVar1->cur_;
  ppcVar3 = &peVar1->cur_;
  if (len < (int)ppcVar3 - (int)pcVar2) {
    memcpy(pcVar2,logline,(long)len);
    *ppcVar3 = *ppcVar3 + len;
  }
  else {
    this_00 = &this->currentBuffer_;
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back(&this->buffers_,this_00);
    std::__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>);
    if ((this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      __p = (FixedBuffer<4000000> *)operator_new(0x3d0908);
      __p->cur_ = (char *)__p;
      std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
      reset<FixedBuffer<4000000>>
                ((__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)this_00,__p);
    }
    else {
      std::__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->nextBuffer_).
                  super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>);
    }
    peVar1 = (this_00->super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pcVar2 = peVar1->cur_;
    ppcVar3 = &peVar1->cur_;
    if (len < (int)ppcVar3 - (int)pcVar2) {
      memcpy(pcVar2,logline,(long)len);
      *ppcVar3 = *ppcVar3 + len;
    }
    pthread_cond_signal((pthread_cond_t *)&(this->cond_).cond);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void AsyncLogging::append(const char* logline, int len) {
  MutexLockGuard lock(mutex_);
  if (currentBuffer_->avail() > len)
    currentBuffer_->append(logline, len);
  else {
    buffers_.push_back(currentBuffer_);
    currentBuffer_.reset();
    if (nextBuffer_)
      currentBuffer_ = std::move(nextBuffer_);
    else
      currentBuffer_.reset(new Buffer);
    currentBuffer_->append(logline, len);
    cond_.notify();
  }
}